

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O0

aiMaterial * __thiscall Assimp::SkeletonMeshBuilder::CreateMaterial(SkeletonMeshBuilder *this)

{
  aiMaterial *this_00;
  int local_450;
  allocator<char> local_449;
  int no_cull;
  undefined1 local_428 [8];
  aiString matName;
  aiMaterial *matHelper;
  SkeletonMeshBuilder *this_local;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&no_cull,"SkeletonMaterial",&local_449);
  aiString::aiString((aiString *)local_428,(string *)&no_cull);
  std::__cxx11::string::~string((string *)&no_cull);
  std::allocator<char>::~allocator(&local_449);
  aiMaterial::AddProperty(this_00,(aiString *)local_428,"?mat.name",0,0);
  local_450 = 1;
  aiMaterial::AddProperty(this_00,&local_450,1,"$mat.twosided",0,0);
  return this_00;
}

Assistant:

aiMaterial* SkeletonMeshBuilder::CreateMaterial()
{
    aiMaterial* matHelper = new aiMaterial;

    // Name
    aiString matName( std::string( "SkeletonMaterial"));
    matHelper->AddProperty( &matName, AI_MATKEY_NAME);

    // Prevent backface culling
    const int no_cull = 1;
    matHelper->AddProperty(&no_cull,1,AI_MATKEY_TWOSIDED);

    return matHelper;
}